

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O0

void do_nms_sort(vector<detection,_std::allocator<detection>_> *dets,int classes,float thresh)

{
  undefined4 uVar1;
  anon_class_4_1_54a3980b __comp;
  undefined4 uVar2;
  __normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_> __last;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  int in_ESI;
  vector<detection,_std::allocator<detection>_> *in_RDI;
  float in_XMM0_Da;
  float fVar6;
  box b;
  int j;
  box a;
  int i_1;
  int k_1;
  int total;
  int i;
  int k;
  box *in_stack_ffffffffffffff88;
  reference in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  __normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_>
  in_stack_ffffffffffffffb0;
  detection *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar7;
  undefined4 in_stack_ffffffffffffffc4;
  int local_20;
  int local_18;
  int local_14;
  
  sVar3 = std::vector<detection,_std::allocator<detection>_>::size(in_RDI);
  local_14 = (int)sVar3 + -1;
  uVar1 = in_stack_ffffffffffffff9c;
  __comp.k = in_stack_ffffffffffffffa4;
  uVar2 = in_stack_ffffffffffffffa8;
  for (local_18 = 0; local_18 <= local_14; local_18 = local_18 + 1) {
    pvVar4 = std::vector<detection,_std::allocator<detection>_>::operator[](in_RDI,(long)local_18);
    if ((pvVar4->objectness == 0.0) && (!NAN(pvVar4->objectness))) {
      in_stack_ffffffffffffff90 =
           std::vector<detection,_std::allocator<detection>_>::operator[](in_RDI,(long)local_18);
      std::vector<detection,_std::allocator<detection>_>::operator[](in_RDI,(long)local_14);
      std::swap<detection>
                ((detection *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
      local_14 = local_14 + -1;
      local_18 = local_18 + -1;
    }
  }
  for (local_20 = 0; local_20 < in_ESI; local_20 = local_20 + 1) {
    std::vector<detection,_std::allocator<detection>_>::begin
              ((vector<detection,_std::allocator<detection>_> *)in_stack_ffffffffffffff88);
    std::vector<detection,_std::allocator<detection>_>::begin
              ((vector<detection,_std::allocator<detection>_> *)in_stack_ffffffffffffff88);
    __gnu_cxx::__normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_>::
    operator+((__normal_iterator<detection_*,_std::vector<detection,_std::allocator<detection>_>_> *
              )CONCAT44(uVar1,in_stack_ffffffffffffff98),(difference_type)in_stack_ffffffffffffff90)
    ;
    __last._M_current._4_4_ = in_stack_ffffffffffffffac;
    __last._M_current._0_4_ = uVar2;
    std::
    sort<__gnu_cxx::__normal_iterator<detection*,std::vector<detection,std::allocator<detection>>>,do_nms_sort(std::vector<detection,std::allocator<detection>>&,int,float)::__0>
              (in_stack_ffffffffffffffb0,__last,__comp);
    for (iVar7 = 0; iVar7 < local_14 + 1; iVar7 = iVar7 + 1) {
      pvVar4 = std::vector<detection,_std::allocator<detection>_>::operator[](in_RDI,(long)iVar7);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&pvVar4->prob,(long)local_20);
      if ((*pvVar5 != 0.0) || (NAN(*pvVar5))) {
        pvVar4 = std::vector<detection,_std::allocator<detection>_>::operator[](in_RDI,(long)iVar7);
        in_stack_ffffffffffffffb0._M_current = *(detection **)&pvVar4->bbox;
        in_stack_ffffffffffffffac = iVar7;
        while (in_stack_ffffffffffffffac = in_stack_ffffffffffffffac + 1,
              in_stack_ffffffffffffffac < local_14 + 1) {
          pvVar4 = std::vector<detection,_std::allocator<detection>_>::operator[]
                             (in_RDI,(long)in_stack_ffffffffffffffac);
          uVar1 = (pvVar4->bbox).x;
          __comp.k = (int)(pvVar4->bbox).w;
          uVar2 = (pvVar4->bbox).h;
          fVar6 = box_iou(&in_stack_ffffffffffffff90->bbox,in_stack_ffffffffffffff88);
          if (in_XMM0_Da < fVar6) {
            pvVar4 = std::vector<detection,_std::allocator<detection>_>::operator[]
                               (in_RDI,(long)in_stack_ffffffffffffffac);
            pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                               (&pvVar4->prob,(long)local_20);
            *pvVar5 = 0.0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void do_nms_sort(std::vector<detection> & dets, int classes, float thresh)
{
    int k = (int)dets.size()-1;
    for (int i = 0; i <= k; ++i) {
        if (dets[i].objectness == 0) {
            std::swap(dets[i], dets[k]);
            --k;
            --i;
        }
    }
    int total = k+1;
    for (int k = 0; k < classes; ++k) {
        std::sort(dets.begin(), dets.begin()+total, [=](const detection & a, const detection & b) {
            return a.prob[k] > b.prob[k];
        });
        for (int i = 0; i < total; ++i) {
            if (dets[i].prob[k] == 0) {
                continue;
            }
            box a = dets[i].bbox;
            for (int j = i+1; j < total; ++j){
                box b = dets[j].bbox;
                if (box_iou(a, b) > thresh) {
                    dets[j].prob[k] = 0;
                }
            }
        }
    }
}